

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool exists_unaccessed_path_to_return
               (CFG *cfg,uint32_t block,
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *blocks)

{
  bool bVar1;
  SmallVector<unsigned_int,_8UL> *pSVar2;
  uint *puVar3;
  uint *succ;
  uint *__end1;
  uint *__begin1;
  SmallVector<unsigned_int,_8UL> *__range1;
  _Node_iterator_base<unsigned_int,_false> local_30;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_28;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *blocks_local;
  CFG *pCStack_18;
  uint32_t block_local;
  CFG *cfg_local;
  
  local_28 = blocks;
  blocks_local._4_4_ = block;
  pCStack_18 = cfg;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::find(blocks,(key_type *)((long)&blocks_local + 4));
  __range1 = (SmallVector<unsigned_int,_8UL> *)
             std::
             end<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                       (local_28);
  bVar1 = std::__detail::operator!=(&local_30,(_Node_iterator_base<unsigned_int,_false> *)&__range1)
  ;
  if (bVar1) {
    cfg_local._7_1_ = false;
  }
  else {
    pSVar2 = spirv_cross::CFG::get_succeeding_edges(pCStack_18,blocks_local._4_4_);
    bVar1 = spirv_cross::VectorView<unsigned_int>::empty(&pSVar2->super_VectorView<unsigned_int>);
    if (bVar1) {
      cfg_local._7_1_ = true;
    }
    else {
      pSVar2 = spirv_cross::CFG::get_succeeding_edges(pCStack_18,blocks_local._4_4_);
      __end1 = spirv_cross::VectorView<unsigned_int>::begin(&pSVar2->super_VectorView<unsigned_int>)
      ;
      puVar3 = spirv_cross::VectorView<unsigned_int>::end(&pSVar2->super_VectorView<unsigned_int>);
      for (; __end1 != puVar3; __end1 = __end1 + 1) {
        bVar1 = exists_unaccessed_path_to_return(pCStack_18,*__end1,local_28);
        if (bVar1) {
          return true;
        }
      }
      cfg_local._7_1_ = false;
    }
  }
  return cfg_local._7_1_;
}

Assistant:

static bool exists_unaccessed_path_to_return(const CFG &cfg, uint32_t block, const unordered_set<uint32_t> &blocks)
{
	// This block accesses the variable.
	if (blocks.find(block) != end(blocks))
		return false;

	// We are at the end of the CFG.
	if (cfg.get_succeeding_edges(block).empty())
		return true;

	// If any of our successors have a path to the end, there exists a path from block.
	for (auto &succ : cfg.get_succeeding_edges(block))
		if (exists_unaccessed_path_to_return(cfg, succ, blocks))
			return true;

	return false;
}